

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmHttpSplitEncodedQuery(jx9_vm *pVm,SyString *pQuery,SyBlob *pWorker,int is_post)

{
  char *zKey;
  sxu32 nByte;
  uint uVar1;
  jx9_value *pjVar2;
  jx9_value *pjVar3;
  ushort **ppuVar4;
  char *pcVar6;
  ulong uVar7;
  ulong in_R8;
  byte *pbVar8;
  byte *zSrc;
  byte *pbVar9;
  jx9_value *pjVar5;
  
  zSrc = (byte *)pQuery->zString;
  uVar1 = pQuery->nByte;
  if (is_post == 0) {
    pcVar6 = "_GET";
    nByte = 4;
  }
  else {
    pcVar6 = "_POST";
    nByte = 5;
  }
  pjVar2 = VmExtractSuper(pVm,pcVar6,nByte);
  pbVar9 = zSrc + uVar1;
  pjVar3 = VmExtractSuper(pVm,"_REQUEST",8);
  pjVar5 = pjVar3;
  for (; zSrc < pbVar9; zSrc = zSrc + 1) {
    ppuVar4 = __ctype_b_loc();
    pjVar5 = (jx9_value *)*ppuVar4;
    pbVar8 = zSrc;
    if ((*(byte *)((long)&((jx9_value *)*ppuVar4)->x + (long)(char)*zSrc * 2 + 1) & 0x20) == 0) {
      while ((pbVar8 < pbVar9 &&
             ((0x3d < (ulong)*pbVar8 || ((0x2800004000000000U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))
             ))) {
        pbVar8 = pbVar8 + 1;
      }
      SyBlobReset(pWorker);
      SyUriDecode((char *)zSrc,(int)pbVar8 - (int)zSrc,jx9VmBlobConsumer,pWorker,(int)in_R8);
      uVar1 = pWorker->nByte;
      if ((pbVar8 < pbVar9) && (*pbVar8 == 0x3d)) {
        for (uVar7 = 1;
            ((zSrc = pbVar8 + uVar7, zSrc < pbVar9 && (*zSrc != 0x26)) && (*zSrc != 0x3b));
            uVar7 = uVar7 + 1) {
        }
        if (uVar7 < 2) {
          uVar7 = 0;
          pcVar6 = (char *)0x0;
        }
        else {
          SyUriDecode((char *)(pbVar8 + 1),(int)uVar7 - 1,jx9VmBlobConsumer,pWorker,(int)in_R8);
          pcVar6 = (char *)((long)pWorker->pBlob + (ulong)uVar1);
          uVar7 = (ulong)(pWorker->nByte - uVar1);
        }
      }
      else {
        uVar7 = 0;
        pcVar6 = (char *)0x0;
        zSrc = pbVar8;
      }
      zKey = (char *)pWorker->pBlob;
      if ((pjVar2 != (jx9_value *)0x0) && ((pjVar2->iFlags & 0x40) != 0)) {
        in_R8 = uVar7;
        VmHashmapInsert((jx9_hashmap *)(pjVar2->x).pOther,zKey,uVar1,pcVar6,(int)uVar7);
      }
      pjVar5 = pjVar3;
      if ((pjVar3 != (jx9_value *)0x0) && ((pjVar3->iFlags & 0x40) != 0)) {
        uVar1 = VmHashmapInsert((jx9_hashmap *)(pjVar3->x).pOther,zKey,uVar1,pcVar6,(int)uVar7);
        pjVar5 = (jx9_value *)(ulong)uVar1;
        in_R8 = uVar7;
      }
    }
  }
  return (sxi32)pjVar5;
}

Assistant:

static sxi32 VmHttpSplitEncodedQuery(
	 jx9_vm *pVm,       /* Target VM */
	 SyString *pQuery,  /* Raw query to decode */
	 SyBlob *pWorker,   /* Working buffer */
	 int is_post        /* TRUE if we are dealing with a POST request */
	 )
 {
	 const char *zEnd = &pQuery->zString[pQuery->nByte];
	 const char *zIn = pQuery->zString;
	 jx9_value *pGet, *pRequest;
	 SyString sName, sValue;
	 const char *zPtr;
	 sxu32 nBlobOfft;
	 /* Extract superglobals */
	 if( is_post ){
		 /* $_POST superglobal */
		 pGet = VmExtractSuper(&(*pVm), "_POST", sizeof("_POST")-1);
	 }else{
		 /* $_GET superglobal */
		 pGet = VmExtractSuper(&(*pVm), "_GET", sizeof("_GET")-1);
	 }
	 pRequest = VmExtractSuper(&(*pVm), "_REQUEST", sizeof("_REQUEST")-1);
	 /* Split up the raw query */
	 for(;;){
		 /* Jump leading white spaces */
		 while(zIn < zEnd  && SyisSpace(zIn[0]) ){
			 zIn++;
		 }
		 if( zIn >= zEnd ){
			 break;
		 }
		 zPtr = zIn;
		 while( zPtr < zEnd && zPtr[0] != '=' && zPtr[0] != '&' && zPtr[0] != ';' ){
			 zPtr++;
		 }
		 /* Reset the working buffer */
		 SyBlobReset(pWorker);
		 /* Decode the entry */
		 SyUriDecode(zIn, (sxu32)(zPtr-zIn), jx9VmBlobConsumer, pWorker, TRUE);
		 /* Save the entry */
		 sName.nByte = SyBlobLength(pWorker);
		 sValue.zString = 0;
		 sValue.nByte = 0;
		 if( zPtr < zEnd && zPtr[0] == '=' ){
			 zPtr++;
			 zIn = zPtr;
			 /* Store field value */
			 while( zPtr < zEnd && zPtr[0] != '&' && zPtr[0] != ';' ){
				 zPtr++;
			 }
			 if( zPtr > zIn ){
				 /* Decode the value */
				  nBlobOfft = SyBlobLength(pWorker);
				  SyUriDecode(zIn, (sxu32)(zPtr-zIn), jx9VmBlobConsumer, pWorker, TRUE);
				  sValue.zString = (const char *)SyBlobDataAt(pWorker, nBlobOfft);
				  sValue.nByte = SyBlobLength(pWorker) - nBlobOfft;
				 
			 }
			 /* Synchronize pointers */
			 zIn = zPtr;
		 }
		 sName.zString = (const char *)SyBlobData(pWorker);
		 /* Install the decoded query in the $_GET/$_REQUEST array */
		 if( pGet && (pGet->iFlags & MEMOBJ_HASHMAP) ){
			 VmHashmapInsert((jx9_hashmap *)pGet->x.pOther, 
				 sName.zString, (int)sName.nByte, 
				 sValue.zString, (int)sValue.nByte
				 );
		 }
		 if( pRequest && (pRequest->iFlags & MEMOBJ_HASHMAP) ){
			 VmHashmapInsert((jx9_hashmap *)pRequest->x.pOther, 
				 sName.zString, (int)sName.nByte, 
				 sValue.zString, (int)sValue.nByte
					 );
		 }
		 /* Advance the pointer */
		 zIn = &zPtr[1];
	 }
	/* All done*/
	return SXRET_OK;
 }